

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

void __thiscall QCompleter::setFilterMode(QCompleter *this,MatchFlags filterMode)

{
  long lVar1;
  long in_FS_OFFSET;
  char local_30 [24];
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if ((QFlagsStorageHelper<Qt::MatchFlag,_4>)((QFlagsStorage<Qt::MatchFlag> *)(lVar1 + 0x9c))->i !=
      (QFlagsStorage<Qt::MatchFlag>)
      filterMode.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.super_QFlagsStorage<Qt::MatchFlag>.i) {
    if ((int)filterMode.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
             super_QFlagsStorage<Qt::MatchFlag>.i - 1U < 3) {
      ((QFlagsStorageHelper<Qt::MatchFlag,_4> *)(lVar1 + 0x9c))->super_QFlagsStorage<Qt::MatchFlag>
           = (QFlagsStorage<Qt::MatchFlag>)
             filterMode.super_QFlagsStorageHelper<Qt::MatchFlag,_4>.
             super_QFlagsStorage<Qt::MatchFlag>.i;
      QCompletionModel::createEngine(*(QCompletionModel **)(lVar1 + 0x88));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        QCompletionModel::invalidate(*(QCompletionModel **)(lVar1 + 0x88));
        return;
      }
      goto LAB_005d42d0;
    }
    local_30[0] = '\x02';
    local_30[1] = '\0';
    local_30[2] = '\0';
    local_30[3] = '\0';
    local_30[0x14] = '\0';
    local_30[0x15] = '\0';
    local_30[0x16] = '\0';
    local_30[0x17] = '\0';
    local_30[4] = '\0';
    local_30[5] = '\0';
    local_30[6] = '\0';
    local_30[7] = '\0';
    local_30[8] = '\0';
    local_30[9] = '\0';
    local_30[10] = '\0';
    local_30[0xb] = '\0';
    local_30[0xc] = '\0';
    local_30[0xd] = '\0';
    local_30[0xe] = '\0';
    local_30[0xf] = '\0';
    local_30[0x10] = '\0';
    local_30[0x11] = '\0';
    local_30[0x12] = '\0';
    local_30[0x13] = '\0';
    local_18 = "default";
    QMessageLogger::warning(local_30,"Unhandled QCompleter::filterMode flag is used.");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
LAB_005d42d0:
  __stack_chk_fail();
}

Assistant:

void QCompleter::setFilterMode(Qt::MatchFlags filterMode)
{
    Q_D(QCompleter);

    if (d->filterMode == filterMode)
        return;

    if (Q_UNLIKELY(filterMode != Qt::MatchStartsWith &&
                   filterMode != Qt::MatchContains &&
                   filterMode != Qt::MatchEndsWith)) {
        qWarning("Unhandled QCompleter::filterMode flag is used.");
        return;
    }

    d->filterMode = filterMode;
    d->proxy->createEngine();
    d->proxy->invalidate();
}